

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O2

void __thiscall
gvr::anon_unknown_3::PLYValueList::PLYValueList
          (PLYValueList *this,ply_type t_size,ply_type t_value,ply_encoding encoding)

{
  PLYValue *pPVar1;
  
  (this->super_PLYValue)._vptr_PLYValue = (_func_int **)&PTR__PLYValueList_00131678;
  (this->list).super__Vector_base<gvr::PLYValue_*,_std::allocator<gvr::PLYValue_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->list).super__Vector_base<gvr::PLYValue_*,_std::allocator<gvr::PLYValue_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->list).super__Vector_base<gvr::PLYValue_*,_std::allocator<gvr::PLYValue_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->enc = encoding;
  pPVar1 = createValue(t_size,encoding);
  this->size = pPVar1;
  this->tvalue = t_value;
  this->used = 0;
  std::vector<gvr::PLYValue_*,_std::allocator<gvr::PLYValue_*>_>::resize(&this->list,1);
  pPVar1 = createValue(t_value,encoding);
  *(this->list).super__Vector_base<gvr::PLYValue_*,_std::allocator<gvr::PLYValue_*>_>._M_impl.
   super__Vector_impl_data._M_start = pPVar1;
  return;
}

Assistant:

PLYValueList(ply_type t_size, ply_type t_value, ply_encoding encoding)
    {
      enc=encoding;
      size=createValue(t_size, encoding);
      tvalue=t_value;
      used=0;
      list.resize(1);
      list[0]=createValue(t_value, encoding);
    }